

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz_zip.c
# Opt level: O3

size_t mz_zip_file_write_func(void *pOpaque,mz_uint64 file_ofs,void *pBuf,size_t n)

{
  int iVar1;
  mz_uint64 mVar2;
  size_t sVar3;
  
  mVar2 = ftello64(*(FILE **)(*(long *)((long)pOpaque + 0x58) + 0x60));
  if ((long)file_ofs < 0) {
    return 0;
  }
  if ((mVar2 != file_ofs) &&
     (iVar1 = fseeko64(*(FILE **)(*(long *)((long)pOpaque + 0x58) + 0x60),file_ofs,0), iVar1 != 0))
  {
    return 0;
  }
  sVar3 = fwrite(pBuf,1,n,*(FILE **)(*(long *)((long)pOpaque + 0x58) + 0x60));
  return sVar3;
}

Assistant:

static size_t mz_zip_file_write_func(void *pOpaque, mz_uint64 file_ofs, const void *pBuf, size_t n)
{
    mz_zip_archive *pZip = (mz_zip_archive *)pOpaque;
    mz_int64 cur_ofs = MZ_FTELL64(pZip->m_pState->m_pFile);

    file_ofs += pZip->m_pState->m_file_archive_start_ofs;

    if (((mz_int64)file_ofs < 0) || (((cur_ofs != (mz_int64)file_ofs)) && (MZ_FSEEK64(pZip->m_pState->m_pFile, (mz_int64)file_ofs, SEEK_SET))))
    {
        mz_zip_set_error(pZip, MZ_ZIP_FILE_SEEK_FAILED);
        return 0;
    }

    return MZ_FWRITE(pBuf, 1, n, pZip->m_pState->m_pFile);
}